

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O2

void emit_peobj_sym_sect(BuildCtx *ctx,PEsection *pesect,int sect)

{
  PEsymaux aux;
  PEsym sym;
  uint32_t local_34;
  ulong local_30;
  undefined8 uStack_28;
  
  if (strtab != (char *)0x0) {
    sym.n = *(anon_union_8_2_92532a80_for_n *)(pesect + (uint)sect);
    sym.value = 0;
    sym.sect = (short)sect + 1;
    sym.type = 0;
    sym.scl = '\x03';
    sym.naux = '\x01';
    owrite(ctx,&sym,0x12);
    uStack_28 = 0;
    local_34 = pesect[(uint)sect].size;
    local_30 = (ulong)pesect[(uint)sect].nreloc;
    owrite(ctx,&local_34,0x12);
  }
  return;
}

Assistant:

static void emit_peobj_sym_sect(BuildCtx *ctx, PEsection *pesect, int sect)
{
  PEsym sym;
  PEsymaux aux;
  if (!strtab) return;  /* Pass 1: no output. */
  memcpy(sym.n.name, pesect[sect].name, 8);
  sym.value = 0;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = PEOBJ_TYPE_NULL;
  sym.scl = PEOBJ_SCL_STATIC;
  sym.naux = 1;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
  memset(&aux, 0, sizeof(PEsymaux));
  aux.size = pesect[sect].size;
  aux.nreloc = pesect[sect].nreloc;
  owrite(ctx, &aux, PEOBJ_SYM_SIZE);
}